

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

void hedg::rest::get_session_id_msg(request<http::string_body> *req,login *login_params)

{
  string_view sname;
  string_view sname_00;
  string local_40;
  
  local_40._M_dataplus._M_p = config::login_host_abi_cxx11_;
  local_40._M_string_length = _DAT_001f16a8;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)req,host,(string_view *)&local_40);
  local_40._M_dataplus._M_p = config::app_key_abi_cxx11_;
  local_40._M_string_length = DAT_001f18c8;
  sname.len_ = 0xd;
  sname.ptr_ = "X-Application";
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)req,sname,(string_view *)&local_40);
  local_40._M_dataplus._M_p = (pointer)config::user_agent_abi_cxx11_._0_8_;
  local_40._M_string_length = config::user_agent_abi_cxx11_._8_8_;
  sname_00.len_ = 0x10;
  sname_00.ptr_ = "X-Authentication";
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)req,sname_00,(string_view *)&local_40);
  local_40._M_dataplus._M_p = "application/x-www-form-urlencoded";
  local_40._M_string_length = 0x21;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)req,content_type,(string_view *)&local_40);
  local_40._M_dataplus._M_p = (pointer)config::user_agent_abi_cxx11_._0_8_;
  local_40._M_string_length = config::user_agent_abi_cxx11_._8_8_;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)req,user_agent,(string_view *)&local_40);
  params::login::body_abi_cxx11_(&local_40,login_params);
  std::__cxx11::string::operator=
            ((string *)
             &req->
              super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
             ,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::prepare_payload(req);
  return;
}

Assistant:

void get_session_id_msg(http::request<http::string_body>& req, params::login login_params) {

		req.set(http::field::host, config::login_host);
		req.set("X-Application", config::app_key);
		req.set("X-Authentication", config::user_agent);
		req.set(http::field::content_type, "application/x-www-form-urlencoded");
		req.set(http::field::user_agent, config::user_agent);
		req.body() = login_params.body();
		req.prepare_payload();
	}